

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

void valid_deserialize_test(void *data,size_t size)

{
  _Bool _Var1;
  size_t sVar2;
  roaring_bitmap_t *r;
  
  sVar2 = roaring_bitmap_portable_deserialize_size((char *)data,size);
  if (sVar2 != size) {
    print_error("ERROR: expected size %zu, got %zu\n",size,sVar2);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
          ,0x9c);
  }
  sVar2 = roaring_bitmap_portable_deserialize_size((char *)data,size - 1);
  _assert_int_equal(sVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                    ,0xa0);
  r = roaring_bitmap_portable_deserialize_safe((char *)data,size);
  _assert_true((unsigned_long)r,"bitmap",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
               ,0xa3);
  _Var1 = roaring_bitmap_internal_validate(r,(char **)0x0);
  _assert_true((ulong)_Var1,"roaring_bitmap_internal_validate(bitmap, NULL)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
               ,0xa4);
  roaring_bitmap_free(r);
  return;
}

Assistant:

static void valid_deserialize_test(const void* data, size_t size) {
    // Ensure that the data _looks_ like a valid bitmap, but is not.
    size_t serialized_size =
        roaring_bitmap_portable_deserialize_size(data, size);
    if (serialized_size != size) {
        fail_msg("expected size %zu, got %zu", size, serialized_size);
    }
    // If we truncate the data by one byte, we should get a size of 0
    assert_int_equal(roaring_bitmap_portable_deserialize_size(data, size - 1),
                     0);
    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    assert_non_null(bitmap);
    assert_true(roaring_bitmap_internal_validate(bitmap, NULL));
    roaring_bitmap_free(bitmap);
}